

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR FILELockFileRegion(SHMPTR shmFileLocks,PVOID pvControllerInstance,UINT64 lockRgnStart,
                            UINT64 nbBytesToLock,LOCK_TYPE lockAction)

{
  bool bVar1;
  SHMFILELOCKS *local_b0;
  SHMFILELOCKS *fileLocks;
  SHMFILELOCKRGNS fakeLock;
  SHMFILELOCKRGNS lockRgn;
  SHMFILELOCKRGNS *insertAfter;
  SHMFILELOCKRGNS *prevLock;
  SHMFILELOCKRGNS *curLock;
  PAL_ERROR palError;
  LOCK_TYPE lockAction_local;
  UINT64 nbBytesToLock_local;
  UINT64 lockRgnStart_local;
  PVOID pvControllerInstance_local;
  SHMPTR shmFileLocks_local;
  
  curLock._0_4_ = 0;
  memset(&fileLocks,0,0x30);
  SHMLock();
  if (nbBytesToLock == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    if (shmFileLocks == 0) {
      local_b0 = (SHMFILELOCKS *)0x0;
      bVar1 = true;
    }
    else {
      local_b0 = (SHMFILELOCKS *)SHMPtrToPtr(shmFileLocks);
      bVar1 = local_b0 != (SHMFILELOCKS *)0x0;
    }
    if ((bVar1) && (local_b0 != (SHMFILELOCKS *)0x0)) {
      if (local_b0->fileLockedRgns == 0) {
        curLock._0_4_ =
             FILEAddNewLockedRgn(local_b0,pvControllerInstance,(SHMFILELOCKRGNS *)0x0,lockRgnStart,
                                 nbBytesToLock,lockAction);
        if (((PAL_ERROR)curLock != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
          abort();
        }
      }
      else {
        insertAfter = (SHMFILELOCKRGNS *)&fileLocks;
        if (local_b0->fileLockedRgns == 0) {
          prevLock = (SHMFILELOCKRGNS *)0x0;
          bVar1 = true;
        }
        else {
          prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(local_b0->fileLockedRgns);
          bVar1 = prevLock != (SHMFILELOCKRGNS *)0x0;
        }
        if (bVar1) {
          fakeLock.next._0_4_ = GetCurrentProcessId();
          do {
            bVar1 = false;
            if (prevLock != (SHMFILELOCKRGNS *)0x0) {
              bVar1 = prevLock->lockRgnStart + prevLock->nbBytesLocked <= lockRgnStart;
            }
            if (!bVar1) goto LAB_00147cc7;
            insertAfter = prevLock;
            if (prevLock->next == 0) {
              prevLock = (SHMFILELOCKRGNS *)0x0;
              bVar1 = true;
            }
            else {
              prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(prevLock->next);
              bVar1 = prevLock != (SHMFILELOCKRGNS *)0x0;
            }
          } while (bVar1);
          fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x1fc);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
          curLock._0_4_ = 0x54f;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                  ,0x1ec);
          fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
          curLock._0_4_ = 0x54f;
        }
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
              ,0x1e0);
      fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
      curLock._0_4_ = 0x54f;
    }
  }
  goto LAB_00148010;
  while( true ) {
    insertAfter = prevLock;
    if (prevLock->next == 0) {
      prevLock = (SHMFILELOCKRGNS *)0x0;
      bVar1 = true;
    }
    else {
      prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(prevLock->next);
      bVar1 = prevLock != (SHMFILELOCKRGNS *)0x0;
    }
    if (!bVar1) break;
LAB_00147cc7:
    bVar1 = false;
    if ((prevLock != (SHMFILELOCKRGNS *)0x0) &&
       (bVar1 = false, lockRgnStart < prevLock->lockRgnStart + prevLock->nbBytesLocked)) {
      bVar1 = prevLock->lockRgnStart < lockRgnStart + nbBytesToLock;
    }
    if (!bVar1) {
      lockRgn.next = (SHMPTR)insertAfter;
      goto LAB_00147e20;
    }
    if ((lockAction == USER_LOCK_RGN) ||
       ((prevLock->lockType == USER_LOCK_RGN &&
        ((prevLock->pvControllerInstance != pvControllerInstance ||
         (prevLock->processId != (DWORD)fakeLock.next)))))) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      curLock._0_4_ = 0x21;
      goto LAB_00148010;
    }
  }
  fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,0x212);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  curLock._0_4_ = 0x54f;
  goto LAB_00148010;
  while( true ) {
    if ((lockAction == USER_LOCK_RGN) ||
       ((prevLock->lockType == USER_LOCK_RGN &&
        ((prevLock->pvControllerInstance != pvControllerInstance ||
         (prevLock->processId != (DWORD)fakeLock.next)))))) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      curLock._0_4_ = 0x21;
      goto LAB_00148010;
    }
    if (prevLock->next == 0) {
      prevLock = (SHMFILELOCKRGNS *)0x0;
      bVar1 = true;
    }
    else {
      prevLock = (SHMFILELOCKRGNS *)SHMPtrToPtr(prevLock->next);
      bVar1 = prevLock != (SHMFILELOCKRGNS *)0x0;
    }
    if (!bVar1) break;
LAB_00147e20:
    bVar1 = false;
    if ((prevLock != (SHMFILELOCKRGNS *)0x0) &&
       (bVar1 = false, prevLock->lockRgnStart < lockRgnStart + nbBytesToLock)) {
      bVar1 = lockRgnStart < prevLock->lockRgnStart + prevLock->nbBytesLocked;
    }
    if (!bVar1) {
      if (insertAfter == (SHMFILELOCKRGNS *)&fileLocks) {
        lockRgn.next = 0;
      }
      curLock._0_4_ =
           FILEAddNewLockedRgn(local_b0,pvControllerInstance,(SHMFILELOCKRGNS *)lockRgn.next,
                               lockRgnStart,nbBytesToLock,lockAction);
      if (((PAL_ERROR)curLock != 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
        abort();
      }
      goto LAB_00148010;
    }
  }
  fprintf(_stderr,"] %s %s:%d","FILELockFileRegion",
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
          ,0x22b);
  fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
  curLock._0_4_ = 0x54f;
LAB_00148010:
  SHMRelease();
  return (PAL_ERROR)curLock;
}

Assistant:

PAL_ERROR
FILELockFileRegion(
    SHMPTR shmFileLocks,
    PVOID pvControllerInstance,
    UINT64 lockRgnStart, 
    UINT64 nbBytesToLock,
    LOCK_TYPE lockAction
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *curLock, *prevLock, *insertAfter, 
                     lockRgn, fakeLock = {0,0,0,0};
    SHMFILELOCKS *fileLocks;

    SHMLock();
    
    /* nothing to do if the region to lock is empty */
    if (nbBytesToLock == 0) 
    {
        TRACE("Locking an empty region (%I64d, %I64d)\n", lockRgnStart, nbBytesToLock);
        goto EXIT;
    }
    
    if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE || fileLocks == NULL)
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }

    if (fileLocks->fileLockedRgns != 0)
    {        
        prevLock = &fakeLock;
        
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, fileLocks->fileLockedRgns) 
            == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            palError = ERROR_INTERNAL_ERROR;
            goto EXIT;
        }
        
        lockRgn.lockRgnStart = lockRgnStart;
        lockRgn.nbBytesLocked = nbBytesToLock;
        lockRgn.pvControllerInstance = pvControllerInstance;
        lockRgn.processId = GetCurrentProcessId();
        lockRgn.lockType = lockAction;

        while((curLock != NULL) && IS_LOCK_BEFORE(curLock, &lockRgn))
        {            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
                
        while((curLock != NULL) && IS_LOCK_INTERSECT(curLock, &lockRgn))
        {
            /* we couldn't lock the requested region if it overlap with other 
               region locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) && 
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
        
        /* save the previous lock in case we need to insert the requested lock */
        insertAfter = prevLock;         
                
        while(((curLock != NULL) && IS_LOCK_INTERSECT(&lockRgn, curLock)))
        {
            /* we couldn't lock the requested region if it overlap with other region 
               locked explicitly (by LockFile call) by other file pointer */
            if ((lockAction == USER_LOCK_RGN) || 
                ((curLock->lockType  == USER_LOCK_RGN) &&  
                 !IS_LOCK_HAVE_SAME_OWNER(curLock, &lockRgn)))
            {
                WARN("The requested lock region overlaps an existing locked region\n");
                palError = ERROR_LOCK_VIOLATION;
                goto EXIT;
            }
            
            prevLock = curLock; 
            if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLock, curLock->next) == FALSE)
            {
                ASSERT("Unable to get pointer from shm pointer.\n");
                palError = ERROR_INTERNAL_ERROR;
                goto EXIT;
            }
        }
       
        if (insertAfter == &fakeLock) 
        {
            insertAfter = NULL;
        }

        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            insertAfter,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );

        if (NO_ERROR != palError)
        {
            WARN("Couldn't add the new locked region into SHM\n");
            goto EXIT;
        }
    }
    else /* lock region list is empty. */
    {
        palError = FILEAddNewLockedRgn(
            fileLocks,
            pvControllerInstance,
            NULL,
            lockRgnStart,
            nbBytesToLock,
            lockAction
            );
        
        if (NO_ERROR != palError)
        {
            ERROR("Couldn't add the first file locked region \n");
            goto EXIT;
        }
    }  

EXIT:
    SHMRelease();
    return palError;
}